

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O1

bool __thiscall
psy::C::Parser::parseCompoundLiteralOrCastExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  IndexType openParenTkIdx;
  ostream *poVar3;
  CastExpressionSyntax *pCVar4;
  IndexType closeParenTkIdx;
  TypeNameSyntax *typeName;
  IndexType local_28;
  TypeNameSyntax *local_20;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == OpenParenToken) {
    openParenTkIdx = consume(this);
    local_20 = (TypeNameSyntax *)0x0;
    bVar1 = parseTypeName(this,&local_20);
    if ((bVar1) && (bVar1 = match(this,CloseParenToken,&local_28), bVar1)) {
      pSVar2 = peek(this,1);
      if (pSVar2->syntaxK_ == OpenBraceToken) {
        bVar1 = parseCompoundLiteral_AtOpenBrace(this,expr,openParenTkIdx,local_20,local_28);
        return bVar1;
      }
      pCVar4 = makeNode<psy::C::CastExpressionSyntax>(this);
      *expr = &pCVar4->super_ExpressionSyntax;
      pCVar4->openParenTkIdx_ = openParenTkIdx;
      pCVar4->typeName_ = local_20;
      pCVar4->closeParenTkIdx_ = local_28;
      bVar1 = parseExpressionWithPrecedenceCast(this,&pCVar4->expr_);
      return bVar1;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x487);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"assert failure: `(\'",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool Parser::parseCompoundLiteralOrCastExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenParenToken,
                  return false,
                  "assert failure: `('");

    auto openParenTkIdx = consume();
    TypeNameSyntax* typeName = nullptr;
    if (!parseTypeName(typeName))
        return false;

    LexedTokens::IndexType closeParenTkIdx;
    if (!match(SyntaxKind::CloseParenToken, &closeParenTkIdx))
        return false;

    if (peek().kind() == SyntaxKind::OpenBraceToken)
        return parseCompoundLiteral_AtOpenBrace(expr,
                                                openParenTkIdx,
                                                typeName,
                                                closeParenTkIdx);

    auto castExpr = makeNode<CastExpressionSyntax>();
    expr = castExpr;
    castExpr->openParenTkIdx_ = openParenTkIdx;
    castExpr->typeName_ = typeName;
    castExpr->closeParenTkIdx_ = closeParenTkIdx;
    return parseExpressionWithPrecedenceCast(castExpr->expr_);
}